

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GetterYs<unsigned_short> *pGVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  uint uVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  double dVar14;
  ImVec2 IVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  dVar14 = (double)(prim + 1);
  pGVar7 = this->Getter1;
  pGVar8 = this->Getter2;
  iVar4 = pGVar7->Count;
  iVar5 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar5].Min;
  dVar20 = (double)IVar1.x;
  dVar23 = (double)IVar1.y;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  fVar12 = (float)(((pGVar7->XScale * dVar14 + pGVar7->X0) - dVar2) * GImPlot->Mx + dVar20);
  fVar13 = (float)(((double)*(ushort *)
                             ((long)pGVar7->Ys +
                             (long)(((prim + 1 + pGVar7->Offset) % iVar4 + iVar4) % iVar4) *
                             (long)pGVar7->Stride) - dVar3) * GImPlot->My[iVar5] + dVar23);
  IVar15.x = (float)(((dVar14 * pGVar8->XScale + pGVar8->X0) - dVar2) * GImPlot->Mx + dVar20);
  IVar15.y = (float)((pGVar8->YRef - dVar3) * GImPlot->My[iVar5] + dVar23);
  fVar19 = (this->P12).x;
  fVar21 = (this->P12).y;
  fVar24 = (this->P11).x;
  fVar25 = (this->P11).y;
  fVar16 = fVar13 * fVar24 - fVar12 * fVar25;
  fVar26 = fVar19 * IVar15.y - fVar21 * IVar15.x;
  fVar24 = fVar24 - fVar12;
  fVar19 = fVar19 - IVar15.x;
  fVar22 = fVar21 - IVar15.y;
  fVar27 = fVar22 * fVar24 - (fVar25 - fVar13) * fVar19;
  auVar17._0_4_ = fVar16 * fVar19 - fVar26 * fVar24;
  auVar17._4_4_ = fVar16 * fVar22 - fVar26 * (fVar25 - fVar13);
  auVar17._8_4_ = fVar13 * 0.0 - fVar21 * 0.0;
  auVar17._12_4_ = fVar13 * 0.0 - fVar21 * 0.0;
  auVar18._4_4_ = fVar27;
  auVar18._0_4_ = fVar27;
  auVar18._8_4_ = fVar22;
  auVar18._12_4_ = fVar22;
  auVar18 = divps(auVar17,auVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  IVar1.y = fVar13;
  IVar1.x = fVar12;
  pIVar9[1].pos = IVar1;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  pIVar9[2].pos = auVar18._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  pIVar9[4].pos = IVar15;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  uVar6 = DrawList->_VtxCurrentIdx;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = uVar6;
  uVar11 = -(uint)(fVar21 < fVar25 && fVar13 < IVar15.y || IVar15.y < fVar13 && fVar25 < fVar21) & 1
  ;
  puVar10[1] = uVar6 + uVar11 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar11 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar12;
  (this->P11).y = fVar13;
  (this->P12).x = IVar15.x;
  (this->P12).y = IVar15.y;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }